

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

bool __thiscall
minihttp::HttpSocket::Download
          (HttpSocket *this,string *url,char *extraRequest,void *user,POST *post)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  undefined1 local_108 [184];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_108._0_8_ = local_108 + 0x10;
  local_108._8_8_ = 0;
  local_108[0x10] = '\0';
  local_108._32_8_ = local_108 + 0x30;
  local_108._40_8_ = 0;
  local_108[0x30] = '\0';
  local_108._64_8_ = local_108 + 0x50;
  local_108._72_8_ = 0;
  local_108[0x50] = '\0';
  local_108._96_8_ = local_108 + 0x70;
  local_108._104_8_ = 0;
  local_108[0x70] = '\0';
  pcVar1 = local_108 + 0x90;
  local_108._136_8_ = (char *)0x0;
  local_108[0x90] = '\0';
  local_108._160_4_ = 0x50;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_108._128_8_ = pcVar1;
  local_108._168_8_ = user;
  local_50._M_p = (pointer)&local_40;
  if (post != (POST *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  SplitURI(url,(string *)local_108,(string *)(local_108 + 0x20),(string *)(local_108 + 0x60),
           (int *)(local_108 + 0xa0),(bool *)(local_108 + 0xb0));
  uVar4 = this->_status - 0x12d;
  if (((uVar4 < 8) && ((199U >> (uVar4 & 0x1f) & 1) != 0)) && (local_108._40_8_ == 0)) {
    std::__cxx11::string::_M_assign((string *)(local_108 + 0x20));
  }
  uVar2 = local_108._136_8_;
  if ((int)local_108._160_4_ < 0) {
    local_108._160_4_ = 0x50;
  }
  if (extraRequest != (char *)0x0) {
    strlen(extraRequest);
    std::__cxx11::string::_M_replace((ulong)(local_108 + 0x80),0,(char *)uVar2,(ulong)extraRequest);
  }
  bVar3 = SendRequest(this,(Request *)local_108,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((pointer)local_108._128_8_ != pcVar1) {
    operator_delete((void *)local_108._128_8_,CONCAT71(local_108._145_7_,local_108[0x90]) + 1);
  }
  if ((undefined1 *)local_108._96_8_ != local_108 + 0x70) {
    operator_delete((void *)local_108._96_8_,CONCAT71(local_108._113_7_,local_108[0x70]) + 1);
  }
  if ((undefined1 *)local_108._64_8_ != local_108 + 0x50) {
    operator_delete((void *)local_108._64_8_,CONCAT71(local_108._81_7_,local_108[0x50]) + 1);
  }
  if ((undefined1 *)local_108._32_8_ != local_108 + 0x30) {
    operator_delete((void *)local_108._32_8_,CONCAT71(local_108._49_7_,local_108[0x30]) + 1);
  }
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
  }
  return bVar3;
}

Assistant:

bool HttpSocket::Download(const std::string& url, const char *extraRequest /*= NULL*/, void *user /* = NULL */, const POST *post /*= NULL*/)
{
    Request req;
    req.user = user;
    if(post)
        req.post = *post;
    SplitURI(url, req.protocol, req.host, req.resource, req.port, req.useSSL);
    if(IsRedirecting() && req.host.empty()) // if we're following a redirection to the same host, the server is likely to omit its hostname
        req.host = _curRequest.host;
    if(req.port < 0)
        req.port = 80;
    if(extraRequest)
        req.extraGetHeaders = extraRequest;
    return SendRequest(req, false);
}